

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O3

int __thiscall gdscpp::resolve_heirarchy_and_bounding_boxes(gdscpp *this)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  long *plVar5;
  pointer pgVar6;
  pointer pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  mapped_type *pmVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  iterator iVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  pointer pgVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer pbVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  pointer pvVar17;
  pointer pgVar18;
  pointer pgVar19;
  pointer pbVar20;
  bool bVar21;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  heirarchy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  string_vector;
  string struct_to_move;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed_structures_list;
  vector<gdsAREF,_std::allocator<gdsAREF>_> arefs;
  vector<gdsSREF,_std::allocator<gdsSREF>_> srefs;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  uint local_150;
  int local_14c;
  value_type local_148;
  value_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  iterator local_100;
  long *local_f8 [2];
  long local_e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<gdsAREF,_std::allocator<gdsAREF>_> local_78;
  vector<gdsSREF,_std::allocator<gdsSREF>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_168.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_168.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_168.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back(&local_168,&local_148);
  pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar17 = local_168.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pgVar13 !=
      (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pvVar17 = local_168.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((pgVar13->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (pgVar13->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         ((pgVar13->AREF).super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pgVar13->AREF).super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_168.
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,&pgVar13->name);
      }
      else {
        pvVar17 = local_168.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
        if (pvVar17 ==
            local_168.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_148,&pgVar13->name);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::push_back(&local_168,&local_148);
          pbVar7 = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar20 = local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar14 = &(local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar14 + -1))->_M_dataplus)._M_p;
              if (paVar14 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar5) {
                operator_delete(plVar5,paVar14->_M_allocated_capacity + 1);
              }
              pbVar15 = (pointer)(paVar14 + 1);
              paVar14 = paVar14 + 2;
            } while (pbVar15 != pbVar7);
            local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar20;
          }
          pvVar17 = local_168.
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar17,&pgVar13->name);
        }
      }
      pgVar13 = pgVar13 + 1;
    } while (pgVar13 !=
             (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (1 < (ulong)(((long)local_168.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_168.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    if (pvVar17 !=
        local_168.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_98 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->STR_Lookup;
      local_150 = 0;
      while( true ) {
        for (pbVar20 = pvVar17[-1].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar20 !=
            pvVar17[-1].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_d8,pbVar20);
        }
        iVar11._M_current =
             (pvVar17->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        if (iVar11._M_current ==
            (pvVar17->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) break;
        local_14c = 0;
        do {
          local_100._M_current = iVar11._M_current;
          pmVar9 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_98,iVar11._M_current);
          iVar2 = *pmVar9;
          std::vector<gdsSREF,_std::allocator<gdsSREF>_>::vector
                    (&local_60,
                     &(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2].SREF);
          std::vector<gdsAREF,_std::allocator<gdsAREF>_>::vector
                    (&local_78,
                     &(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2].AREF);
          pgVar6 = local_60.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_108 = pvVar17;
          if (local_60.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_60.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar21 = true;
            pgVar19 = local_78.super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            do {
              pgVar18 = pgVar6 + 1;
              local_b8[0] = local_a8;
              pcVar4 = (pgVar6->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_b8,pcVar4,pcVar4 + (pgVar6->name)._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_48,&local_d8);
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (local_48.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_48.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,(string *)local_b8);
              pbVar20 = local_48.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              bVar21 = _Var10._M_current !=
                       local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if (local_b8[0] != local_a8) {
                operator_delete(local_b8[0],local_a8[0] + 1);
              }
              pgVar19 = local_78.super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
                        super__Vector_impl_data._M_start;
            } while ((_Var10._M_current != pbVar20) &&
                    (pgVar6 = pgVar18,
                    pgVar18 !=
                    local_60.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                    super__Vector_impl_data._M_finish));
          }
          for (; pgVar19 !=
                 local_78.super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
                 super__Vector_impl_data._M_finish; pgVar19 = pgVar19 + 1) {
            local_f8[0] = local_e8;
            pcVar4 = (pgVar19->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f8,pcVar4,pcVar4 + (pgVar19->name)._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_90,&local_d8);
            _Var10 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (local_90.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                local_90.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,local_f8);
            pbVar20 = local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_90);
            if (local_f8[0] != local_e8) {
              operator_delete(local_f8[0],local_e8[0] + 1);
            }
            if (_Var10._M_current == pbVar20) goto LAB_00123795;
          }
          if (bVar21) {
            iVar11._M_current = local_100._M_current + 1;
            pvVar17 = local_108;
          }
          else {
LAB_00123795:
            iVar11._M_current = local_100._M_current;
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            pcVar4 = ((local_100._M_current)->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar4,pcVar4 + (local_100._M_current)->_M_string_length
                      );
            pvVar8 = local_108;
            iVar11 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::_M_erase(local_108,iVar11);
            if (pvVar8 + 1 ==
                local_168.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_148,&local_128);
              std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::push_back(&local_168,&local_148);
              pbVar7 = local_148.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pbVar20 = local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_148.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_148.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                paVar14 = &(local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_2;
                do {
                  plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(paVar14 + -1))->_M_dataplus)._M_p;
                  if (paVar14 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar5) {
                    operator_delete(plVar5,paVar14->_M_allocated_capacity + 1);
                  }
                  pbVar15 = (pointer)(paVar14 + 1);
                  paVar14 = paVar14 + 2;
                } while (pbVar15 != pbVar7);
                local_148.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar20;
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvVar8 + 1,&local_128);
            }
            pvVar17 = local_168.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            local_14c = local_14c + 1;
            pvVar17 = pvVar17 + -2;
          }
          std::vector<gdsAREF,_std::allocator<gdsAREF>_>::~vector(&local_78);
          std::vector<gdsSREF,_std::allocator<gdsSREF>_>::~vector(&local_60);
        } while (iVar11._M_current !=
                 (pvVar17->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
        local_150 = local_150 & 0xff;
        if (local_14c == 0) {
          local_150 = 1;
        }
        if (((local_150 & 1) != 0) ||
           (pvVar17 = pvVar17 + 1,
           pvVar17 ==
           local_168.
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) break;
      }
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
              (local_168.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_168.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_168.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start <=
      local_168.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish + -1) {
    pvVar8 = local_168.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    pvVar16 = local_168.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar17 = local_168.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pvVar12 = pvVar8;
      pbVar20 = pvVar17[-1].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar20 !=
          pvVar17[-1].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pmVar9 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->STR_Lookup,pbVar20);
          iVar2 = *pmVar9;
          (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2].heirarchical_level =
               (int)((ulong)((long)pvVar12 -
                            (long)local_168.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          calculate_STR_bounding_box(this,iVar2,(int *)&local_128);
          pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar1 = pgVar13[iVar2].bounding_box;
          *(pointer *)piVar1 = local_128._M_dataplus._M_p;
          *(size_type *)(piVar1 + 2) = local_128._M_string_length;
          uVar3 = pgVar13[iVar2].heirarchical_level;
          if ((uint)this->highest_heirarchical_level < uVar3) {
            this->highest_heirarchical_level = uVar3;
          }
          pbVar20 = pbVar20 + 1;
          pvVar16 = local_168.
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (pbVar20 !=
                 pvVar17[-1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pvVar8 = pvVar12 + -1;
      pvVar17 = pvVar12;
    } while (pvVar16 <= pvVar12 + -1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_168);
  return 0;
}

Assistant:

int gdscpp::resolve_heirarchy_and_bounding_boxes()
{
  // ========== Part 1: Populate heirarchy ===========
  int heirarchical_levels = 0;
  vector<vector<string>> heirarchy;
  heirarchy.clear();
  vector<string> string_vector;
  vector<string> allowed_structures_list; // Allowes structure names
  heirarchy.push_back(string_vector);     // Creates first level
  vector<vector<string>>::iterator heir_iter = heirarchy.begin();
  auto struct_it = STR.begin();
  while (struct_it != STR.end()) {
    if ((struct_it->SREF.empty() && (struct_it->AREF.empty()))) {
      heir_iter = heirarchy.begin();
      heir_iter->push_back(struct_it->name);
    } else {
      heir_iter = heirarchy.begin();
      heir_iter++;
      if (heir_iter == heirarchy.end()) {
        heir_iter--;
        string_vector.push_back(struct_it->name);
        heirarchy.push_back(string_vector); // Creates second level
        string_vector.clear();
        heir_iter = heirarchy.end(); // | Point back to last line of heirarchy.
        heir_iter--;                 // |
      } else {
        heir_iter->push_back(struct_it->name);
      }
    }
    struct_it++;
  }
  // At this stage all structures that use references are on level 2.
  // We need to separate those that reference secondary structures and so on
  // If there are no references there will only be one level (no heirarchy).
  if (heirarchy.size() > 1) {
    bool nothing_added = false;
    while ((nothing_added == false) && (heir_iter != heirarchy.end())) {
      // Add the previous level to allowable names
      heir_iter--; // Go to previous level to fetch allowed names
      auto structures_iterator = heir_iter->begin();
      while (structures_iterator != heir_iter->end()) {
        allowed_structures_list.push_back(*structures_iterator);
        structures_iterator++;
      }
      // Compare every name on current level's references to list of allowable
      // names
      heir_iter++; // Return to current level to compare this level's names vs
                   // allowed
      structures_iterator = heir_iter->begin();
      int names_shifted = 0;
      while (structures_iterator !=
             heir_iter->end()) // For each name in the set
      {
        int fetch_index =
            STR_Lookup[*structures_iterator]; // Get what STR vector index
                                              // *structures_iterator references
        vector<gdsSREF> srefs = STR[fetch_index].SREF;
        vector<gdsAREF> arefs = STR[fetch_index].AREF;
        auto SREF_it = srefs.begin();
        bool failed = false;
        while (SREF_it != srefs.end()) {
          if (!check_name(SREF_it->name, allowed_structures_list)) {
            failed = true;
            break;
          }
          SREF_it++;
        }
        auto AREF_it = arefs.begin();
        while (AREF_it != arefs.end()) {
          if (!check_name(AREF_it->name, allowed_structures_list)) {
            failed = true;
            break;
          }
          AREF_it++;
        }
        // if any of the SREF or aref of target structure fail test, the
        // structure must be moved down
        if (failed == true) {
          string struct_to_move = *structures_iterator;
          structures_iterator = heir_iter->erase(structures_iterator);
          heir_iter++; // Move to level below
          if (heir_iter ==
              heirarchy.end()) // if level below doesn't exist, make it.
          {
            heir_iter--; // Reverse iterator to last element.
            string_vector.push_back(struct_to_move);
            heirarchy.push_back(string_vector); // Push back the set
            string_vector.clear(); // Clear the temporary set container
          } else {
            // string_vector.push_back(
            //     struct_to_move); // Next level already exists, simply add the
            //                      // word
            heir_iter->push_back(struct_to_move);//Adding the word [22 Apr]
          }
          heir_iter = heirarchy.end(); // |
          heir_iter--;                 // | Return to current level.
          heir_iter--;                 // |
          names_shifted++;
        } else {
          structures_iterator++;
        }
      }
      if (names_shifted == 0) {
        nothing_added = true;
      }
      heir_iter++; // Move onto next level and repeat
    }
    // Reverse order of heirarchy function
    reverse(heirarchy.begin(), heirarchy.end());
  }
  // ========== Part 2: Set heirarchy into structures ===========
  // ==========      Also calculate bounding boxes    ===========
  heir_iter = heirarchy.end();
  heir_iter--;
  while (!(heir_iter < heirarchy.begin())) {
    auto structure_iterator = heir_iter->begin();
    while (structure_iterator != heir_iter->end()) {
      int STR_index = STR_Lookup[*structure_iterator];
      STR[STR_index].heirarchical_level = heir_iter - heirarchy.begin();
      int b_box[4] = {0, 0, 0, 0};
      calculate_STR_bounding_box(STR_index, b_box);
      STR[STR_index].bounding_box[0] = b_box[0];
      STR[STR_index].bounding_box[1] = b_box[1];
      STR[STR_index].bounding_box[2] = b_box[2];
      STR[STR_index].bounding_box[3] = b_box[3];
      if (STR[STR_index].heirarchical_level > highest_heirarchical_level)
        highest_heirarchical_level = STR[STR_index].heirarchical_level;
      structure_iterator++;
    }
    heir_iter--;
  }
  return EXIT_SUCCESS;
}